

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O2

void ply_reverse(void *anydata,size_t size)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  ulong uVar3;
  
  puVar2 = (undefined1 *)((size - 1) + (long)anydata);
  for (uVar3 = 0; size >> 1 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = *(undefined1 *)((long)anydata + uVar3);
    *(undefined1 *)((long)anydata + uVar3) = *puVar2;
    *puVar2 = uVar1;
    puVar2 = puVar2 + -1;
  }
  return;
}

Assistant:

static void ply_reverse(void *anydata, size_t size) {
    char *data = (char *)anydata;
    char temp;
    size_t i;
    for (i = 0; i < size / 2; i++) {
        temp = data[i];
        data[i] = data[size - i - 1];
        data[size - i - 1] = temp;
    }
}